

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFromBtreeZeroOffset(BtCursor *pCur,u32 amt,Mem *pMem)

{
  long lVar1;
  Btree *pBVar2;
  BtCursor *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  int rc;
  u32 available;
  Mem *in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffd0;
  u32 offset;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  offset = 0;
  pBVar2 = (Btree *)sqlite3BtreePayloadFetch
                              ((BtCursor *)(ulong)in_stack_ffffffffffffffd0,
                               (u32 *)in_stack_ffffffffffffffc8);
  in_RDX->pBtree = pBVar2;
  if (in_ESI == 0) {
    *(undefined2 *)((long)&in_RDX->aOverflow + 4) = 0x4010;
    *(undefined4 *)&in_RDX->aOverflow = 0;
  }
  else {
    offset = sqlite3VdbeMemFromBtree
                       (in_RDX,offset,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return offset;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtreeZeroOffset(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  u32 available = 0;  /* Number of bytes available on the local btree page */
  int rc = SQLITE_OK; /* Return code */

  assert( sqlite3BtreeCursorIsValid(pCur) );
  assert( !VdbeMemDynamic(pMem) );

  /* Note: the calls to BtreeKeyFetch() and DataFetch() below assert()
  ** that both the BtShared and database handle mutexes are held. */
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  pMem->z = (char *)sqlite3BtreePayloadFetch(pCur, &available);
  assert( pMem->z!=0 );

  if( amt<=available ){
    pMem->flags = MEM_Blob|MEM_Ephem;
    pMem->n = (int)amt;
  }else{
    rc = sqlite3VdbeMemFromBtree(pCur, 0, amt, pMem);
  }

  return rc;
}